

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

uint32_t hex32_to_digest(char *data)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  undefined4 local_14;
  anon_union_4_2_0e95b672 result;
  char *data_local;
  
  uVar1 = hex8_to_digest(data);
  uVar2 = hex8_to_digest(data + 2);
  uVar3 = hex8_to_digest(data + 4);
  uVar4 = hex8_to_digest(data + 6);
  local_14 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
  uVar5 = ntohl(local_14);
  return uVar5;
}

Assistant:

uint32_t hex32_to_digest(const char data[8])
{
	union {
		uint32_t	value;
		uint8_t		parts[4];
	} result;

	result.parts[0] = hex8_to_digest(&data[0]);
	result.parts[1] = hex8_to_digest(&data[2]);
	result.parts[2] = hex8_to_digest(&data[4]);
	result.parts[3] = hex8_to_digest(&data[6]);

	return ntohl(result.value);
}